

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

bool s2pred::ArePointsLinearlyDependent(Vector3_xf *x,Vector3_xf *y)

{
  int iVar1;
  ExactFloat *pEVar2;
  bool local_6d;
  undefined1 local_48 [8];
  Vector3_xf n;
  Vector3_xf *y_local;
  Vector3_xf *x_local;
  
  n.c_[2].bn_.bn_ = (BIGNUM *)y;
  Vector3<ExactFloat>::CrossProd((Vector3<ExactFloat> *)local_48,x,y);
  pEVar2 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                     ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_48,0);
  iVar1 = ExactFloat::sgn(pEVar2);
  local_6d = false;
  if (iVar1 == 0) {
    pEVar2 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                       ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_48,1);
    iVar1 = ExactFloat::sgn(pEVar2);
    local_6d = false;
    if (iVar1 == 0) {
      pEVar2 = util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
                         ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_48,2);
      iVar1 = ExactFloat::sgn(pEVar2);
      local_6d = iVar1 == 0;
    }
  }
  Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_48);
  return local_6d;
}

Assistant:

bool ArePointsLinearlyDependent(const Vector3_xf& x, const Vector3_xf& y) {
  Vector3_xf n = x.CrossProd(y);
  return n[0].sgn() == 0 && n[1].sgn() == 0 && n[2].sgn() == 0;
}